

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O2

int test_strutil_match(ITesting *t)

{
  bool bVar1;
  kTRContinueMode kVar2;
  
  bVar1 = trun::match("funcflurp","*flurp");
  if ((!bVar1) &&
     (kVar2 = (*t->AssertError)(0x42,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"trun::match(\"funcflurp\", \"*flurp\")"), kVar2 == kTRLeave)) {
    return 0x10;
  }
  bVar1 = trun::match("mod_apa_bpa","mod_*_bpa");
  if ((!bVar1) &&
     (kVar2 = (*t->AssertError)(0x43,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"trun::match(\"mod_apa_bpa\", \"mod_*_bpa\")"), kVar2 == kTRLeave))
  {
    return 0x10;
  }
  bVar1 = trun::match("mod_apa_bpa","mod*");
  if ((!bVar1) &&
     (kVar2 = (*t->AssertError)(0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"trun::match(\"mod_apa_bpa\", \"mod*\")"), kVar2 == kTRLeave)) {
    return 0x10;
  }
  bVar1 = trun::match("mod_apa_bpa","mod_bpa_*");
  if ((bVar1) &&
     (kVar2 = (*t->AssertError)(0x45,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"!trun::match(\"mod_apa_bpa\", \"mod_bpa_*\")"), kVar2 == kTRLeave)
     ) {
    return 0x10;
  }
  bVar1 = trun::match("test_mod_func1","func");
  if ((bVar1) &&
     (kVar2 = (*t->AssertError)(0x46,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"!trun::match(\"test_mod_func1\", \"func\")"), kVar2 == kTRLeave))
  {
    return 0x10;
  }
  bVar1 = trun::match("func","func1");
  if ((bVar1) &&
     (kVar2 = (*t->AssertError)(0x47,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"!trun::match(\"func\", \"func1\")"), kVar2 == kTRLeave)) {
    return 0x10;
  }
  bVar1 = trun::match("sometestfunc","sometest");
  if ((bVar1) &&
     (kVar2 = (*t->AssertError)(0x48,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                                ,"!trun::match(\"sometestfunc\", \"sometest\")"), kVar2 == kTRLeave)
     ) {
    return 0x10;
  }
  return 0;
}

Assistant:

DLL_EXPORT int test_strutil_match(ITesting *t) {
    TR_ASSERT(t, trun::match("funcflurp", "*flurp"));
    TR_ASSERT(t, trun::match("mod_apa_bpa", "mod_*_bpa"));
    TR_ASSERT(t, trun::match("mod_apa_bpa", "mod*"));
    TR_ASSERT(t, !trun::match("mod_apa_bpa", "mod_bpa_*"));
    TR_ASSERT(t, !trun::match("test_mod_func1", "func"));
    TR_ASSERT(t, !trun::match("func", "func1"));
    TR_ASSERT(t, !trun::match("sometestfunc", "sometest"));
    return kTR_Pass;
}